

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

int SSL_get_dtls_read_traffic_secret(SSL *ssl,uint8_t **out_data,size_t *out_len,uint16_t epoch)

{
  uint16_t uVar1;
  DTLSReadEpoch *pDVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  
  if (ssl->method->is_dtls == false) {
    abort();
  }
  iVar4 = 0;
  iVar5 = 0;
  if ((epoch != 0) && (iVar5 = iVar4, ssl->s3->version != 0)) {
    uVar1 = bssl::ssl_protocol_version(ssl);
    if (0x303 < uVar1) {
      pDVar2 = bssl::dtls_get_read_epoch(ssl,epoch);
      if (pDVar2 != (DTLSReadEpoch *)0x0) {
        uVar3 = (ulong)(pDVar2->traffic_secret).size_;
        if (uVar3 == 0) {
          __assert_fail("!epoch_state->traffic_secret.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                        ,0xb6a,
                        "int get_dtls_traffic_secret(const SSL *, EpochState *(*)(const SSL *, uint16_t), const uint8_t **, size_t *, uint16_t) [EpochState = bssl::DTLSReadEpoch]"
                       );
        }
        *out_data = (uint8_t *)&pDVar2->traffic_secret;
        *out_len = uVar3;
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int SSL_get_dtls_read_traffic_secret(const SSL *ssl, const uint8_t **out_data,
                                     size_t *out_len, uint16_t epoch) {
  return get_dtls_traffic_secret(ssl, dtls_get_read_epoch, out_data, out_len,
                                 epoch);
}